

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke.c
# Opt level: O0

int build_suite_id(ptls_buffer_t *buf,ptls_hpke_kem_t *kem,ptls_hpke_cipher_suite_t *cipher)

{
  undefined1 local_34;
  undefined1 local_33;
  uint16_t local_32;
  undefined1 local_30;
  undefined1 local_2f;
  uint16_t local_2e;
  undefined1 local_2c;
  undefined1 local_2b;
  uint16_t _v_3;
  undefined1 local_28;
  undefined1 local_27;
  uint16_t _v_2;
  int iStack_24;
  uint16_t _v_1;
  uint16_t _v;
  ptls_hpke_cipher_suite_t *ppStack_20;
  int ret;
  ptls_hpke_cipher_suite_t *cipher_local;
  ptls_hpke_kem_t *kem_local;
  ptls_buffer_t *buf_local;
  
  ppStack_20 = cipher;
  cipher_local = (ptls_hpke_cipher_suite_t *)kem;
  kem_local = (ptls_hpke_kem_t *)buf;
  if (cipher == (ptls_hpke_cipher_suite_t *)0x0) {
    iStack_24 = ptls_buffer__do_pushv(buf,"KEM",3);
    if (iStack_24 != 0) {
      return iStack_24;
    }
    _v_2 = (cipher_local->id).kdf;
    local_28 = (undefined1)(_v_2 >> 8);
    local_27 = (undefined1)_v_2;
    iStack_24 = ptls_buffer__do_pushv((ptls_buffer_t *)kem_local,&local_28,2);
  }
  else {
    iStack_24 = ptls_buffer__do_pushv(buf,"HPKE",4);
    if (iStack_24 != 0) {
      return iStack_24;
    }
    _v_3 = (cipher_local->id).kdf;
    local_2c = (undefined1)(_v_3 >> 8);
    local_2b = (undefined1)_v_3;
    iStack_24 = ptls_buffer__do_pushv((ptls_buffer_t *)kem_local,&local_2c,2);
    if (iStack_24 != 0) {
      return iStack_24;
    }
    local_2e = (ppStack_20->id).kdf;
    local_30 = (undefined1)(local_2e >> 8);
    local_2f = (undefined1)local_2e;
    iStack_24 = ptls_buffer__do_pushv((ptls_buffer_t *)kem_local,&local_30,2);
    if (iStack_24 != 0) {
      return iStack_24;
    }
    local_32 = (ppStack_20->id).aead;
    local_34 = (undefined1)(local_32 >> 8);
    local_33 = (undefined1)local_32;
    iStack_24 = ptls_buffer__do_pushv((ptls_buffer_t *)kem_local,&local_34,2);
  }
  if (iStack_24 == 0) {
    iStack_24 = 0;
  }
  return iStack_24;
}

Assistant:

static int build_suite_id(ptls_buffer_t *buf, ptls_hpke_kem_t *kem, ptls_hpke_cipher_suite_t *cipher)
{
    int ret;

    if (cipher == NULL) {
        ptls_buffer_pushv(buf, "KEM", 3);
        ptls_buffer_push16(buf, kem->id);
    } else {
        ptls_buffer_pushv(buf, "HPKE", 4);
        ptls_buffer_push16(buf, kem->id);
        ptls_buffer_push16(buf, cipher->id.kdf);
        ptls_buffer_push16(buf, cipher->id.aead);
    }

    ret = 0;

Exit:
    return ret;
}